

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O3

void __thiscall
QWidgetLineControl::processShortcutOverrideEvent(QWidgetLineControl *this,QKeyEvent *ke)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  StandardKey SVar4;
  
  if (ke == (QKeyEvent *)0x0) {
LAB_00426e4c:
    iVar2 = QKeyEvent::modifiers();
    if ((iVar2 != 0) &&
       ((iVar2 = QKeyEvent::modifiers(), iVar2 != 0x2000000 &&
        (iVar2 = QKeyEvent::modifiers(), iVar2 != 0x20000000)))) {
      return;
    }
    if (0xffffff < *(int *)(ke + 0x40)) {
      uVar3 = *(int *)(ke + 0x40) + 0xfefffffd;
      if (0x11 < uVar3) {
        return;
      }
      if ((0x2e000U >> (uVar3 & 0x1f) & 1) != 0) goto LAB_00426ea5;
      if ((0x11U >> (uVar3 & 0x1f) & 1) == 0) {
        return;
      }
    }
  }
  else {
    SVar4 = (StandardKey)ke;
    cVar1 = QKeyEvent::matches(SVar4);
    if (((((cVar1 != '\0') || (cVar1 = QKeyEvent::matches(SVar4), cVar1 != '\0')) ||
         (cVar1 = QKeyEvent::matches(SVar4), cVar1 != '\0')) ||
        ((cVar1 = QKeyEvent::matches(SVar4), cVar1 != '\0' ||
         (cVar1 = QKeyEvent::matches(SVar4), cVar1 != '\0')))) ||
       ((((cVar1 = QKeyEvent::matches(SVar4), cVar1 != '\0' ||
          ((cVar1 = QKeyEvent::matches(SVar4), cVar1 != '\0' ||
           (cVar1 = QKeyEvent::matches(SVar4), cVar1 != '\0')))) ||
         (cVar1 = QKeyEvent::matches(SVar4), cVar1 != '\0')) ||
        ((((cVar1 = QKeyEvent::matches(SVar4), cVar1 != '\0' ||
           (cVar1 = QKeyEvent::matches(SVar4), cVar1 != '\0')) ||
          (cVar1 = QKeyEvent::matches(SVar4), cVar1 != '\0')) ||
         (((cVar1 = QKeyEvent::matches(SVar4), cVar1 != '\0' ||
           (cVar1 = QKeyEvent::matches(SVar4), cVar1 != '\0')) ||
          ((cVar1 = QKeyEvent::matches(SVar4), cVar1 != '\0' ||
           (cVar1 = QKeyEvent::matches(SVar4), cVar1 != '\0')))))))))) goto LAB_00426ea5;
    cVar1 = QKeyEvent::matches(SVar4);
    if (((cVar1 == '\0') && (cVar1 = QKeyEvent::matches(SVar4), cVar1 == '\0')) &&
       ((cVar1 = QKeyEvent::matches(SVar4), cVar1 == '\0' &&
        ((cVar1 = QKeyEvent::matches(SVar4), cVar1 == '\0' &&
         (cVar1 = QKeyEvent::matches(SVar4), cVar1 == '\0')))))) goto LAB_00426e4c;
  }
  if (((byte)this[0x50] & 4) != 0) {
    return;
  }
LAB_00426ea5:
  ke[0xc] = (QKeyEvent)0x1;
  return;
}

Assistant:

void QWidgetLineControl::processShortcutOverrideEvent(QKeyEvent *ke)
{
    if (ke == QKeySequence::Copy
        || ke == QKeySequence::MoveToNextWord
        || ke == QKeySequence::MoveToPreviousWord
        || ke == QKeySequence::MoveToStartOfLine
        || ke == QKeySequence::MoveToEndOfLine
        || ke == QKeySequence::MoveToStartOfDocument
        || ke == QKeySequence::MoveToEndOfDocument
        || ke == QKeySequence::SelectNextWord
        || ke == QKeySequence::SelectPreviousWord
        || ke == QKeySequence::SelectStartOfLine
        || ke == QKeySequence::SelectEndOfLine
        || ke == QKeySequence::SelectStartOfBlock
        || ke == QKeySequence::SelectEndOfBlock
        || ke == QKeySequence::SelectStartOfDocument
        || ke == QKeySequence::SelectAll
        || ke == QKeySequence::SelectEndOfDocument) {
        ke->accept();
    } else if (ke == QKeySequence::Paste
               || ke == QKeySequence::Cut
               || ke == QKeySequence::Redo
               || ke == QKeySequence::Undo
               || ke == QKeySequence::DeleteCompleteLine) {
        if (!isReadOnly())
            ke->accept();
    } else if (ke->modifiers() == Qt::NoModifier || ke->modifiers() == Qt::ShiftModifier
               || ke->modifiers() == Qt::KeypadModifier) {
        if (ke->key() < Qt::Key_Escape) {
            if (!isReadOnly())
                ke->accept();
        } else {
            switch (ke->key()) {
            case Qt::Key_Delete:
            case Qt::Key_Backspace:
                if (!isReadOnly())
                    ke->accept();
                break;

            case Qt::Key_Home:
            case Qt::Key_End:
            case Qt::Key_Left:
            case Qt::Key_Right:
                ke->accept();
                break;

            default:
                break;
            }
        }
    }
}